

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::DefaultSampling<float>::genFixeds
          (DefaultSampling<float> *this,FloatFormat *format,
          vector<float,_std::allocator<float>_> *dst)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  int local_44;
  value_type_conflict2 local_40;
  int sign;
  float local_38;
  float local_34;
  float maxQuantum;
  float minNormalized;
  float minQuantum;
  int fractionBits;
  int maxExp;
  int minExp;
  vector<float,_std::allocator<float>_> *dst_local;
  FloatFormat *format_local;
  DefaultSampling<float> *this_local;
  
  _maxExp = dst;
  dst_local = (vector<float,_std::allocator<float>_> *)format;
  format_local = (FloatFormat *)this;
  fractionBits = tcu::FloatFormat::getMinExp(format);
  minQuantum = (float)tcu::FloatFormat::getMaxExp((FloatFormat *)dst_local);
  minNormalized = (float)tcu::FloatFormat::getFractionBits((FloatFormat *)dst_local);
  maxQuantum = deFloatLdExp(1.0,fractionBits - (int)minNormalized);
  local_34 = deFloatLdExp(1.0,fractionBits);
  local_38 = deFloatLdExp(1.0,(int)minQuantum - (int)minNormalized);
  pvVar1 = _maxExp;
  sign = (int)std::numeric_limits<float>::quiet_NaN();
  std::vector<float,_std::allocator<float>_>::push_back(pvVar1,(value_type_conflict2 *)&sign);
  local_40 = 0.0;
  std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_40);
  for (local_44 = -1; local_44 < 2; local_44 = local_44 + 2) {
    local_48 = (float)local_44 * maxQuantum;
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_48);
    local_4c = (float)local_44 * (local_34 - maxQuantum);
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_4c);
    local_50 = (float)local_44 * local_34;
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_50);
    local_54 = (float)local_44 * (local_34 + maxQuantum);
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_54);
    local_58 = (float)local_44 * 0.5;
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_58);
    local_5c = (float)local_44 * 1.0;
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_5c);
    local_60 = (float)local_44 * 2.0;
    std::vector<float,_std::allocator<float>_>::push_back(_maxExp,&local_60);
    pvVar1 = _maxExp;
    fVar2 = (float)local_44;
    fVar3 = deFloatLdExp(1.0,(int)minQuantum);
    fVar4 = deFloatLdExp(1.0,(int)minQuantum);
    local_64 = fVar2 * (fVar3 + (fVar4 - local_38));
    std::vector<float,_std::allocator<float>_>::push_back(pvVar1,&local_64);
    pvVar1 = _maxExp;
    fVar2 = (float)local_44;
    local_68 = std::numeric_limits<float>::infinity();
    local_68 = fVar2 * local_68;
    std::vector<float,_std::allocator<float>_>::push_back(pvVar1,&local_68);
  }
  return;
}

Assistant:

void DefaultSampling<float>::genFixeds (const FloatFormat& format, vector<float>& dst) const
{
	const int			minExp			= format.getMinExp();
	const int			maxExp			= format.getMaxExp();
	const int			fractionBits	= format.getFractionBits();
	const float			minQuantum		= deFloatLdExp(1.0f, minExp - fractionBits);
	const float			minNormalized	= deFloatLdExp(1.0f, minExp);
	const float			maxQuantum		= deFloatLdExp(1.0f, maxExp - fractionBits);

	// NaN
	dst.push_back(TCU_NAN);
	// Zero
	dst.push_back(0.0f);

	for (int sign = -1; sign <= 1; sign += 2)
	{
		// Smallest subnormal
		dst.push_back((float)sign * minQuantum);

		// Largest subnormal
		dst.push_back((float)sign * (minNormalized - minQuantum));

		// Smallest normalized
		dst.push_back((float)sign * minNormalized);

		// Next smallest normalized
		dst.push_back((float)sign * (minNormalized + minQuantum));

		dst.push_back((float)sign * 0.5f);
		dst.push_back((float)sign * 1.0f);
		dst.push_back((float)sign * 2.0f);

		// Largest number
		dst.push_back((float)sign * (deFloatLdExp(1.0f, maxExp) +
									(deFloatLdExp(1.0f, maxExp) - maxQuantum)));

		dst.push_back((float)sign * TCU_INFINITY);
	}
}